

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

int __thiscall doctest::Context::run(Context *this)

{
  int iVar1;
  ContextState *pCVar2;
  undefined8 uVar3;
  TestData *pTVar4;
  char *pcVar5;
  TestData *pTVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  _Base_ptr p_Var12;
  const_iterator cVar13;
  code *__compar;
  detail *this_00;
  Color *pCVar14;
  char *pcVar15;
  _Rb_tree_node_base *p_Var16;
  Color *pCVar17;
  Context *pCVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  testArray;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilters;
  char buff [1024];
  uint local_534;
  ulong local_530;
  _Rb_tree_node_base *local_528;
  _Rb_tree_node_base *p_Stack_520;
  long local_518;
  TestData *local_508;
  Context *local_500;
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  local_4f8;
  undefined1 local_4c8 [24];
  undefined1 local_4b0 [24];
  undefined1 local_498 [24];
  undefined1 local_480 [24];
  undefined1 local_468 [48];
  String local_438 [129];
  
  detail::getContextState::data = this->p;
  pCVar2 = this->p;
  pCVar2->numAssertions = 0;
  pCVar2->numFailedAssertions = 0;
  if (((pCVar2->no_run != false) || (pCVar2->version != false)) || (pCVar2->help == true)) {
    this_00 = (detail *)this;
    if (pCVar2->version == true) {
      detail::printVersion((detail *)this);
    }
    if (this->p->help == true) {
      detail::printHelp(this_00);
    }
    detail::getContextState::data = (ContextState *)0x0;
    return 0;
  }
  local_500 = this;
  detail::printVersion((detail *)this);
  detail::Color::use((Color *)this,Cyan);
  pCVar14 = (Color *)0x108421;
  printf("%s");
  detail::Color::use(pCVar14,None);
  pcVar15 = "run with \"--help\" for options";
  puts("run with \"--help\" for options");
  detail::getRegisteredTests();
  local_528 = (_Rb_tree_node_base *)0x0;
  p_Stack_520 = (_Rb_tree_node_base *)0x0;
  local_518 = 0;
  if ((_Rb_tree_header *)
      detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    p_Var12 = detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar15 = (char *)p_Var12;
      local_438[0].m_str = pcVar15 + 0x20;
      std::vector<doctest::detail::TestData_const*,std::allocator<doctest::detail::TestData_const*>>
      ::emplace_back<doctest::detail::TestData_const*>
                ((vector<doctest::detail::TestData_const*,std::allocator<doctest::detail::TestData_const*>>
                  *)&local_528,(TestData **)local_438);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar15);
    } while ((_Rb_tree_header *)p_Var12 !=
             &detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var16 = local_528;
  lVar20 = (long)p_Stack_520 - (long)local_528;
  if (lVar20 != 0) {
    pCVar2 = local_500->p;
    pcVar15 = (pCVar2->order_by).m_str;
    iVar9 = detail::stricmp(pcVar15,"file");
    if (iVar9 == 0) {
      __compar = detail::fileOrderComparator;
    }
    else {
      iVar9 = detail::stricmp(pcVar15,"suite");
      if (iVar9 == 0) {
        __compar = detail::suiteOrderComparator;
      }
      else {
        iVar9 = detail::stricmp(pcVar15,"name");
        if (iVar9 != 0) {
          iVar9 = detail::stricmp(pcVar15,"rand");
          if (iVar9 == 0) {
            uVar10 = pCVar2->rand_seed;
            pcVar15 = (char *)(ulong)uVar10;
            srand(uVar10);
            p_Var16 = local_528;
            uVar21 = (ulong)((long)p_Stack_520 - (long)local_528) >> 3;
            uVar10 = (int)uVar21 - 1;
            if (uVar10 != 0) {
              uVar7 = (ulong)uVar10;
              do {
                uVar19 = uVar7 - 1;
                uVar10 = rand();
                uVar3 = *(undefined8 *)(&p_Var16->_M_color + uVar7 * 2);
                lVar20 = (long)(int)((ulong)uVar10 % (uVar21 & 0xffffffff));
                *(undefined8 *)(&p_Var16->_M_color + uVar7 * 2) =
                     *(undefined8 *)(&p_Var16->_M_color + lVar20 * 2);
                *(undefined8 *)(&p_Var16->_M_color + lVar20 * 2) = uVar3;
                uVar21 = (ulong)((int)uVar21 - 1);
                uVar7 = uVar19;
              } while ((int)uVar19 != 0);
            }
          }
          goto LAB_00105ebb;
        }
        __compar = detail::nameOrderComparator;
      }
    }
    qsort(p_Var16,lVar20 >> 3,8,__compar);
    pcVar15 = (char *)p_Var16;
  }
LAB_00105ebb:
  pCVar18 = local_500;
  if (local_500->p->list_test_cases == true) {
    detail::Color::use((Color *)pcVar15,Cyan);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    pcVar15 = "listing all test case names";
    puts("listing all test case names");
  }
  local_4f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4f8._M_impl.super__Rb_tree_header._M_header;
  local_4f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_530 = 0;
  local_4f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pCVar18->p->list_test_suites == true) {
    detail::Color::use((Color *)pcVar15,Cyan);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    pcVar15 = "listing all test suites";
    puts("listing all test suites");
  }
  local_534 = 0;
  if (p_Stack_520 != local_528) {
    p_Var16 = (_Rb_tree_node_base *)(local_468 + 0x18);
    local_534 = 0;
    local_530 = 0;
    uVar21 = 0;
    do {
      pTVar4 = *(TestData **)(&local_528->_M_color + uVar21 * 2);
      pcVar15 = pTVar4->m_file;
      std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                ((vector<doctest::String,_std::allocator<doctest::String>_> *)p_Var16,
                 (pCVar18->p->filters).
                 super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar9 = detail::matchesAny(pcVar15,(vector<doctest::String,_std::allocator<doctest::String>_>
                                          *)p_Var16,1,pCVar18->p->case_sensitive);
      pcVar15 = (char *)p_Var16;
      std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                ((vector<doctest::String,_std::allocator<doctest::String>_> *)p_Var16);
      if (iVar9 == 0) {
LAB_001062fd:
        bVar8 = false;
      }
      else {
        pcVar5 = pTVar4->m_file;
        std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_468,
                   (pCVar18->p->filters).
                   super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        bVar8 = false;
        pcVar15 = local_468;
        local_508 = pTVar4;
        iVar9 = detail::matchesAny(pcVar5,(vector<doctest::String,_std::allocator<doctest::String>_>
                                           *)pcVar15,0,pCVar18->p->case_sensitive);
        std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                  ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar15);
        pTVar4 = local_508;
        if (iVar9 == 0) {
          pcVar5 = local_508->m_suite;
          std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_480,
                     (pCVar18->p->filters).
                     super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
          pcVar15 = local_480;
          iVar9 = detail::matchesAny(pcVar5,(vector<doctest::String,_std::allocator<doctest::String>_>
                                             *)pcVar15,1,pCVar18->p->case_sensitive);
          std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar15);
          if (iVar9 != 0) {
            pcVar5 = pTVar4->m_suite;
            std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_498,
                       (pCVar18->p->filters).
                       super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3);
            bVar8 = false;
            pcVar15 = local_498;
            iVar9 = detail::matchesAny(pcVar5,(vector<doctest::String,_std::allocator<doctest::String>_>
                                               *)pcVar15,0,pCVar18->p->case_sensitive);
            std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar15);
            pTVar4 = local_508;
            if (iVar9 != 0) goto LAB_00106300;
            pcVar5 = local_508->m_name;
            std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_4b0,
                       (pCVar18->p->filters).
                       super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
            pcVar15 = local_4b0;
            iVar9 = detail::matchesAny(pcVar5,(vector<doctest::String,_std::allocator<doctest::String>_>
                                               *)pcVar15,1,pCVar18->p->case_sensitive);
            std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                      ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar15);
            if (iVar9 != 0) {
              pcVar5 = pTVar4->m_name;
              std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                        ((vector<doctest::String,_std::allocator<doctest::String>_> *)local_4c8,
                         (pCVar18->p->filters).
                         super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 5);
              bVar8 = false;
              pcVar15 = local_4c8;
              iVar9 = detail::matchesAny(pcVar5,(vector<doctest::String,_std::allocator<doctest::String>_>
                                                 *)pcVar15,0,pCVar18->p->case_sensitive);
              std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector
                        ((vector<doctest::String,_std::allocator<doctest::String>_> *)pcVar15);
              pTVar4 = local_508;
              if (iVar9 != 0) goto LAB_00106300;
              uVar10 = (int)local_530 + 1;
              local_530 = (ulong)uVar10;
              pCVar2 = pCVar18->p;
              if (pCVar2->count == false) {
                if (pCVar2->list_test_cases == true) {
                  pcVar15 = local_508->m_name;
                  puts(pcVar15);
                }
                else if (pCVar2->list_test_suites == true) {
                  String::String(local_438,local_508->m_suite);
                  cVar13 = std::
                           _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                           ::find(&local_4f8,local_438);
                  pcVar15 = local_438[0].m_str;
                  free(local_438[0].m_str);
                  if ((_Rb_tree_header *)cVar13._M_node == &local_4f8._M_impl.super__Rb_tree_header)
                  {
                    puts(pTVar4->m_suite);
                    String::String(local_438,pTVar4->m_suite);
                    std::
                    _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                    ::_M_insert_unique<doctest::String>(&local_4f8,local_438);
                    pcVar15 = local_438[0].m_str;
                    free(local_438[0].m_str);
                  }
                }
                else if (((uVar10 <= pCVar2->last) || (pCVar2->last < pCVar2->first)) &&
                        (pCVar2->first <= uVar10)) {
                  (pCVar2->super_TestAccessibleContextState).currentTest = local_508;
                  (pCVar2->super_TestAccessibleContextState).hasLoggedCurrentTestStart = false;
                  if (((pCVar2->super_TestAccessibleContextState).success == true) &&
                     ((detail::getContextState::data->super_TestAccessibleContextState).
                      hasLoggedCurrentTestStart == false)) {
                    pTVar6 = (detail::getContextState::data->super_TestAccessibleContextState).
                             currentTest;
                    detail::logTestStart(pTVar6->m_name,pTVar6->m_file,pTVar6->m_line);
                    (detail::getContextState::data->super_TestAccessibleContextState).
                    hasLoggedCurrentTestStart = true;
                  }
                  std::
                  _Rb_tree<doctest::detail::SubcaseSignature,_doctest::detail::SubcaseSignature,_std::_Identity<doctest::detail::SubcaseSignature>,_std::less<doctest::detail::SubcaseSignature>,_std::allocator<doctest::detail::SubcaseSignature>_>
                  ::clear(&(pCVar18->p->subcasesPassed)._M_t);
                  iVar9 = 0;
                  do {
                    pCVar2 = pCVar18->p;
                    (pCVar2->super_TestAccessibleContextState).numAssertionsForCurrentTestcase = 0;
                    pCVar2->numFailedAssertionsForCurrentTestcase = 0;
                    pCVar2->subcasesHasSkipped = false;
                    pCVar2->subcasesCurrentLevel = 0;
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    clear(&(pCVar2->subcasesEnteredLevels)._M_t);
                    pcVar15 = (char *)pTVar4->m_f;
                    iVar11 = detail::callTestFunc((funcType)pcVar15);
                    pCVar2 = pCVar18->p;
                    iVar1 = pCVar2->abort_after;
                    pCVar2->numAssertions =
                         pCVar2->numAssertions +
                         (pCVar2->super_TestAccessibleContextState).numAssertionsForCurrentTestcase;
                    if ((0 < iVar1) && (iVar1 <= pCVar2->numFailedAssertions)) {
                      pCVar2->subcasesHasSkipped = false;
                    }
                    iVar9 = iVar9 + iVar11;
                    (pCVar2->super_TestAccessibleContextState).hasLoggedCurrentTestStart = false;
                  } while (pCVar2->subcasesHasSkipped != false);
                  local_534 = (local_534 + 1) - (uint)(iVar9 == 0);
                  if ((0 < iVar1) && (bVar8 = true, iVar1 <= pCVar2->numFailedAssertions))
                  goto LAB_00106300;
                }
              }
            }
          }
          goto LAB_001062fd;
        }
      }
LAB_00106300:
      pCVar18 = local_500;
    } while ((!bVar8) &&
            (uVar21 = (ulong)((int)uVar21 + 1),
            uVar21 < (ulong)((long)p_Stack_520 - (long)local_528 >> 3)));
  }
  detail::Color::use((Color *)pcVar15,(local_534 == 0) + Red);
  pCVar14 = (Color *)&DAT_001092ed;
  puts("===============================================================================");
  detail::Color::use(pCVar14,None);
  pCVar2 = pCVar18->p;
  if ((pCVar2->count == false) &&
     ((pCVar2->list_test_cases == false && (pCVar2->list_test_suites != true)))) {
    detail::Color::use(pCVar14,Cyan);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    pCVar14 = (Color *)local_438;
    snprintf((char *)pCVar14,0x400,"test cases: %4d",local_530);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar14,None);
      pCVar14 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar14,None);
    }
    pCVar17 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar14,None);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    snprintf((char *)pCVar17,0x400,"%4d passed",(ulong)((int)local_530 - local_534));
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar17,(uint)(local_534 == 0) * 3);
      pCVar17 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar17,None);
    }
    pCVar14 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar17,None);
    pCVar17 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar17,None);
    snprintf((char *)pCVar14,0x400,"%4d failed",(ulong)local_534);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar14,(uint)(local_534 != 0) * 2);
      pCVar14 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar14,None);
    }
    pCVar17 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar14,None);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    snprintf((char *)pCVar17,0x400,"%4d skipped\n",
             (ulong)(uint)((int)((ulong)((long)p_Stack_520 - (long)local_528) >> 3) - (int)local_530
                          ));
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar17,None);
      pCVar17 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar17,None);
    }
    detail::Color::use(pCVar17,Cyan);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    pCVar14 = (Color *)local_438;
    snprintf((char *)pCVar14,0x400,"assertions: %4d",(ulong)(uint)pCVar18->p->numAssertions);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar14,None);
      pCVar14 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar14,None);
    }
    pCVar17 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar14,None);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    snprintf((char *)pCVar17,0x400,"%4d passed",
             (ulong)(uint)(pCVar18->p->numAssertions - pCVar18->p->numFailedAssertions));
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar17,(uint)(local_534 == 0) * 3);
      pCVar17 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar17,None);
    }
    pCVar14 = (Color *)local_438;
    local_438[0].m_str._0_4_ = 0x207c20;
    detail::Color::use(pCVar17,None);
    pCVar17 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar17,None);
    snprintf((char *)pCVar14,0x400,"%4d failed",(ulong)(uint)pCVar18->p->numFailedAssertions);
    if (local_438[0].m_str._0_1_ != (Color)0x0) {
      detail::Color::use(pCVar14,(uint)(0 < pCVar18->p->numFailedAssertions) * 2);
      pCVar14 = (Color *)0x108421;
      printf("%s");
      detail::Color::use(pCVar14,None);
    }
    local_438[0].m_str._0_4_ = 0xa7c20;
    detail::Color::use(pCVar14,None);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
  }
  else {
    detail::Color::use(pCVar14,Cyan);
    pCVar14 = (Color *)0x108421;
    printf("%s");
    detail::Color::use(pCVar14,None);
    printf("number of tests passing the current filters: %d\n",local_530);
  }
  detail::getContextState::data = (ContextState *)0x0;
  if ((local_534 == 0) || (iVar9 = 1, pCVar18->p->no_exitcode == true)) {
    iVar9 = 0;
  }
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&local_4f8);
  if (local_528 != (_Rb_tree_node_base *)0x0) {
    operator_delete(local_528,local_518 - (long)local_528);
  }
  return iVar9;
}

Assistant:

int Context::run() {
    using namespace detail;

    getContextState() = p;
    p->resetRunData();

    // handle version, help and no_run
    if(p->no_run || p->version || p->help) {
        if(p->version)
            printVersion();
        if(p->help)
            printHelp();

        getContextState() = 0;

        return EXIT_SUCCESS;
    }

    printVersion();
    DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
    printf("run with \"--help\" for options\n");

    unsigned i = 0; // counter used for loops - here for VC6

    std::set<TestData>& registeredTests = getRegisteredTests();

    std::vector<const TestData*> testArray;
    for(std::set<TestData>::iterator it = registeredTests.begin(); it != registeredTests.end();
        ++it)
        testArray.push_back(&(*it));

    // sort the collected records
    if(testArray.size() > 0) {
        if(p->order_by.compare("file", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            srand(p->rand_seed);

            // random_shuffle implementation
            const TestData** first = &testArray[0];
            for(i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = rand() % (i + 1);

                const TestData* temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        }
    }

    if(p->list_test_cases) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test case names\n");
    }

    std::set<String> testSuitesPassingFilters;
    if(p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test suites\n");
    }

    unsigned numTestsPassingFilters = 0;
    unsigned numFailed              = 0;
    // invoke the registered functions if they match the filter criteria (or just count them)
    for(i = 0; i < testArray.size(); i++) {
        const TestData& data = *testArray[i];
        if(!matchesAny(data.m_file, p->filters[0], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_file, p->filters[1], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_suite, p->filters[2], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_suite, p->filters[3], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_name, p->filters[4], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_name, p->filters[5], 0, p->case_sensitive))
            continue;

        numTestsPassingFilters++;

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            printf("%s\n", data.m_name);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if(testSuitesPassingFilters.count(data.m_suite) == 0) {
                printf("%s\n", data.m_suite);
                testSuitesPassingFilters.insert(data.m_suite);
            }
            continue;
        }

        // skip the test if it is not in the execution range
        if((p->last < numTestsPassingFilters && p->first <= p->last) ||
           (p->first > numTestsPassingFilters))
            continue;

        // execute the test if it passes all the filtering
        {
#ifdef _MSC_VER
//__try {
#endif // _MSC_VER

            p->currentTest = &data;

            // if logging successful tests - force the start log
            p->hasLoggedCurrentTestStart = false;
            if(p->success)
                DOCTEST_LOG_START();

            unsigned didFail = 0;
            p->subcasesPassed.clear();
            do {
                // reset the assertion state
                p->numAssertionsForCurrentTestcase       = 0;
                p->numFailedAssertionsForCurrentTestcase = 0;

                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->subcasesHasSkipped   = false;
                p->subcasesCurrentLevel = 0;
                p->subcasesEnteredLevels.clear();

                // execute the test
                didFail += callTestFunc(data.m_f);
                p->numAssertions += p->numAssertionsForCurrentTestcase;

                // exit this loop if enough assertions have failed
                if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                    p->subcasesHasSkipped = false;

                // if the start has been logged
                if(p->hasLoggedCurrentTestStart)
                    logTestEnd();
                p->hasLoggedCurrentTestStart = false;

            } while(p->subcasesHasSkipped == true);

            if(didFail > 0)
                numFailed++;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                break;

#ifdef _MSC_VER
//} __except(1) {
//    printf("Unknown SEH exception caught!\n");
//    numFailed++;
//}
#endif // _MSC_VER
        }
    }

    DOCTEST_PRINTF_COLORED(getSeparator(), numFailed > 0 ? Color::Red : Color::Green);
    if(p->count || p->list_test_cases || p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("number of tests passing the current filters: %d\n", numTestsPassingFilters);
    } else {
        char buff[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "test cases: %4d", numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         numTestsPassingFilters - numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d skipped\n",
                         static_cast<unsigned>(testArray.size()) - numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "assertions: %4d", p->numAssertions);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         p->numAssertions - p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, p->numFailedAssertions > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " |\n");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
    }

    // remove any coloring
    DOCTEST_PRINTF_COLORED("", Color::None);

    getContextState() = 0;

    if(numFailed && !p->no_exitcode)
        return EXIT_FAILURE;
    return EXIT_SUCCESS;
}